

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall DnsHashEntry::DnsHashEntry(DnsHashEntry *this)

{
  this->count = 0;
  this->key_type = 0;
  this->key_length = 0;
  this->HashNext = (DnsHashEntry *)0x0;
  this->hash = 0;
  this->registry_id = 0;
  (this->field_6).key_number = 0;
  return;
}

Assistant:

DnsHashEntry::DnsHashEntry()
    :
    HashNext(NULL),
    hash(0),
    registry_id(0),
    count(0),
    key_type(0),
    key_length(0),
    key_number(0)
{
    key_value[0] = 0;
}